

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

StructDefinition __thiscall adios2::VariableNT::GetWriteStructDef(VariableNT *this)

{
  StructDefinition *ptr;
  long *in_RDI;
  StructDefinition *CoreSD;
  allocator *__rhs;
  allocator *__lhs;
  string local_110 [20];
  int in_stack_ffffffffffffff04;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [32];
  string *in_stack_ffffffffffffff78;
  VariableBase *in_stack_ffffffffffffff80;
  allocator local_59;
  string local_58 [39];
  allocator local_31;
  string local_30 [40];
  StructDefinition local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"in call to VariableNT::StructFieldElementCount",&local_31);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (*(int *)(*in_RDI + 0x28) != 0x10) {
    __lhs = &local_59;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"bindings::CXX11",__lhs);
    __rhs = (allocator *)&stack0xffffffffffffff7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff80,"VariableNT",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"StructFieldElementCount",&local_a9);
    adios2::ToString_abi_cxx11_((DataType)local_110);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)__rhs);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  ptr = (StructDefinition *)adios2::core::VariableStruct::GetWriteStructDef();
  StructDefinition::StructDefinition(&local_8,ptr);
  return (StructDefinition)local_8.m_StructDefinition;
}

Assistant:

StructDefinition VariableNT::GetWriteStructDef() noexcept
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFieldElementCount");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT",
                                          "StructFieldElementCount",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    core::StructDefinition *CoreSD =
        reinterpret_cast<core::VariableStruct *>(m_Variable)->GetWriteStructDef();
    return StructDefinition(CoreSD);
}